

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emle.c
# Opt level: O2

xlik_css_object xlik_css_init(int p,int d,int q,int s,int P,int D,int Q,int M,int N)

{
  uint uVar1;
  uint uVar2;
  xlik_css_object pxVar3;
  ulong uVar4;
  uint uVar5;
  ulong uVar6;
  double dVar7;
  
  uVar5 = P * s + p;
  uVar1 = Q * s + 1 + q;
  uVar2 = uVar1;
  if (Q * s + q < (int)uVar5) {
    uVar2 = uVar5;
  }
  pxVar3 = (xlik_css_object)malloc((long)(int)uVar2 * 0x10 + (long)(M + 3) * (long)N * 8 + 0x68);
  pxVar3->p = p;
  pxVar3->d = d;
  pxVar3->q = q;
  pxVar3->s = s;
  pxVar3->P = P;
  pxVar3->D = D;
  pxVar3->Q = Q;
  pxVar3->M = M;
  pxVar3->N = N;
  pxVar3->Nmncond = N;
  pxVar3->length = N;
  if ((int)uVar1 < (int)uVar5) {
    uVar1 = uVar5;
  }
  pxVar3->pq = q + p + P + Q + M;
  pxVar3->r = uVar1;
  pxVar3->offset = uVar1 * 2;
  uVar4 = 0;
  uVar6 = (ulong)uVar1;
  if ((int)uVar1 < 1) {
    uVar6 = 0;
  }
  for (; uVar6 != uVar4; uVar4 = uVar4 + 1) {
    pxVar3->x[uVar4] = 0.0;
  }
  for (uVar4 = 0; uVar6 != uVar4; uVar4 = uVar4 + 1) {
    pxVar3->x[(long)(int)uVar2 + uVar4] = 0.0;
  }
  dVar7 = macheps();
  pxVar3->eps = dVar7;
  pxVar3->mean = 0.0;
  return pxVar3;
}

Assistant:

xlik_css_object xlik_css_init(int p, int d, int q, int s, int P, int D, int Q,int M, int N) {
	xlik_css_object obj = NULL;
	int i, r, t;

	r = p + s*P;

	t = q + s*Q + 1;

	if (r < t) {
		r = t;
	}
	else {
		t = r;
	}

	obj = (xlik_css_object)malloc(sizeof(struct xlik_css_set) + sizeof(double)* 2 * r + sizeof(double)* (3+M) * N);

	obj->p = p;
	obj->d = d;
	obj->q = q;
	obj->s = s;
	obj->P = P;
	obj->D = D;
	obj->Q = Q;
	obj->M = M; // This will include the mean term and the exogenous terms
	obj->N = N;
	obj->Nmncond = N;
	obj->length = N;
	obj->pq = p + q + P + Q + M;

	obj->r = p + s * P;

	t = 1 + q + s*Q;
	if (obj->r < t) {
		obj->r = t;
	}
	t = obj->r;
	obj->offset = 2 * obj->r;

	for (i = 0; i < t; ++i) {
		obj->x[i] = 0.0;// phi
	}

	for (i = 0; i < t; ++i) {
		obj->x[i + r] = 0.0;//theta
	}
	obj->eps = macheps();
	obj->mean = 0.0;

	return obj;
}